

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.cpp
# Opt level: O0

void __thiscall
piksel::BaseApp::updateFramebufferSize(BaseApp *this,int framebufferWidth,int framebufferHeight)

{
  mat<4,_4,_float,_(glm::qualifier)0> local_a0;
  mat<4,_4,_float,_(glm::qualifier)0> local_60;
  float local_20;
  float local_1c;
  float ratio;
  float framebufferRatio;
  int framebufferHeight_local;
  int framebufferWidth_local;
  BaseApp *this_local;
  
  this->framebufferWidth = framebufferWidth;
  this->framebufferHeight = framebufferHeight;
  ratio = (float)framebufferHeight;
  framebufferRatio = (float)framebufferWidth;
  _framebufferHeight_local = this;
  (*glad_glViewport)(0,0,framebufferWidth,framebufferHeight);
  local_1c = (float)(int)framebufferRatio / (float)(int)ratio;
  local_20 = (float)this->width / (float)this->height;
  if (local_1c < local_20) {
    glm::ortho<float>(&local_a0,0.0,(float)this->width,(local_20 / local_1c) * (float)this->height,
                      0.0);
    memcpy(&this->projectionMatrix,&local_a0,0x40);
  }
  else {
    glm::ortho<float>(&local_60,0.0,(local_1c / local_20) * (float)this->width,(float)this->height,
                      0.0);
    memcpy(&this->projectionMatrix,&local_60,0x40);
  }
  return;
}

Assistant:

void BaseApp::updateFramebufferSize(int framebufferWidth, int framebufferHeight) {
    this->framebufferWidth = framebufferWidth;
    this->framebufferHeight = framebufferHeight;
    glViewport(0, 0, framebufferWidth, framebufferHeight);
    float framebufferRatio = framebufferWidth / (float) framebufferHeight;
    float ratio = width / (float) height;
    if (framebufferRatio >= ratio) {
        projectionMatrix = glm::ortho(0.0f, (framebufferRatio / ratio) * width, (float) height, 0.0f);
    } else {
        projectionMatrix = glm::ortho(0.0f, (float) width, (ratio / framebufferRatio) * height, 0.0f);
    }
#if FXAA
    if (postfx_texture) {
        glBindTexture(GL_TEXTURE_2D, postfx_texture);
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, framebufferWidth, framebufferHeight, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);
    }
#endif
}